

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int saxParseTest(char *filename,char *result,char *err,int options)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *__filename;
  undefined8 *puVar5;
  undefined8 uVar6;
  long lVar7;
  uint uVar8;
  char *extraout_RDX;
  char *pcVar9;
  long lVar10;
  char *filename_00;
  int iVar11;
  long lVar12;
  debugContext userData;
  uint uStack_a4;
  char *pcStack_a0;
  char *pcStack_98;
  char *pcStack_90;
  char *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  nb_tests = nb_tests + 1;
  pcVar9 = temp_directory;
  filename_00 = filename;
  uVar8 = options;
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    saxParseTest_cold_1();
    nb_tests = nb_tests + 1;
    iVar11 = loadMem(filename_00,&pcStack_a0,(int *)&uStack_a4);
    uVar2 = uStack_a4;
    if (iVar11 == 0) {
      uVar4 = 4;
      if ((int)uStack_a4 < 4) {
        uVar4 = uStack_a4;
      }
      pcStack_98 = pcVar9;
      pcStack_90 = extraout_RDX;
      if ((uVar8 >> 0x1e & 1) == 0) {
        lVar7 = xmlCreatePushParserCtxt(0,0,pcStack_a0,uVar4,filename_00);
      }
      else {
        lVar7 = htmlCreatePushParserCtxt(0,0,pcStack_a0,uVar4,filename_00,0);
      }
      xmlCtxtSetErrorHandler(lVar7,testStructuredErrorHandler,0);
      xmlCtxtUseOptions(lVar7,uVar8);
      uVar4 = 4;
      if ((int)uVar2 < 4) {
        uVar4 = uVar2;
      }
      lVar12 = (long)(int)uVar4 << 0x20;
      lVar10 = (long)(int)uVar4;
      do {
        lVar1 = lVar10 + 0x400;
        if ((int)uStack_a4 <= lVar1) {
          if ((uVar8 >> 0x1e & 1) == 0) {
            xmlParseChunk();
          }
          else {
            htmlParseChunk(lVar7,pcStack_a0 + (lVar12 >> 0x20),(ulong)uStack_a4 - lVar10,1);
          }
          break;
        }
        if ((uVar8 >> 0x1e & 1) == 0) {
          xmlParseChunk();
        }
        else {
          htmlParseChunk(lVar7,pcStack_a0 + lVar10,0x400,0);
        }
        lVar12 = lVar12 + 0x40000000000;
        lVar10 = lVar1;
      } while (lVar1 < (int)uStack_a4);
      uVar6 = *(undefined8 *)(lVar7 + 0x10);
      if ((uVar8 >> 0x1e & 1) == 0) {
        iVar11 = *(int *)(lVar7 + 0x18);
        xmlFreeParserCtxt(lVar7);
        free(pcStack_a0);
        if (iVar11 == 0) {
          xmlFreeDoc(uVar6);
          pcVar9 = "Failed to parse %s\n";
          goto LAB_001098bc;
        }
      }
      else {
        xmlFreeParserCtxt(lVar7);
        free(pcStack_a0);
      }
      if ((uVar8 >> 0x1e & 1) == 0) {
        xmlDocDumpMemory();
      }
      else {
        htmlDocDumpMemory(uVar6,&pcStack_a0,&uStack_a4);
      }
      pcVar9 = pcStack_98;
      xmlFreeDoc(uVar6);
      iVar11 = compareFileMem(pcVar9,pcStack_a0,uStack_a4);
      if ((pcStack_a0 == (char *)0x0) || (iVar11 != 0)) {
        if (pcStack_a0 != (char *)0x0) {
          (*_xmlFree)();
        }
        fprintf(_stderr,"Result for %s failed in %s\n",filename_00,pcVar9);
        return -1;
      }
      (*_xmlFree)();
      if (pcStack_90 == (char *)0x0) {
        return 0;
      }
      iVar11 = compareFileMem(pcStack_90,testErrors,testErrorsSize);
      if (iVar11 == 0) {
        return 0;
      }
      pcVar9 = "Error for %s failed\n";
    }
    else {
      pcVar9 = "Failed to load %s\n";
    }
LAB_001098bc:
    fprintf(_stderr,pcVar9,filename_00);
    return -1;
  }
  SAXdebug = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)SAXdebug == (FILE *)0x0) {
    fprintf(_stderr,"Failed to write to %s\n",__filename);
    iVar11 = -1;
    goto LAB_00109635;
  }
  if (((uint)options >> 0x1e & 1) == 0) {
    puVar5 = (undefined8 *)xmlCreateFileParserCtxt(filename);
    memcpy((void *)*puVar5,&emptySAXHandlerStruct,0x100);
    xmlCtxtUseOptions(puVar5,options);
    xmlParseDocument(puVar5);
    iVar11 = 0;
    if (*(int *)(puVar5 + 3) == 0) {
      iVar11 = *(int *)(puVar5 + 0x11);
    }
    xmlFreeDoc(puVar5[2]);
    xmlFreeParserCtxt(puVar5);
  }
  else {
    iVar11 = 0;
    uVar6 = htmlNewSAXParserCtxt(&emptySAXHandlerStruct,0);
    htmlCtxtReadFile(uVar6,filename,0,options);
    htmlFreeParserCtxt(uVar6);
  }
  if (iVar11 == 0x1a) {
    iVar11 = 0;
    fprintf((FILE *)SAXdebug,"xmlParseDocument returned error %d\n",0x1a);
  }
  if (iVar11 == 0) {
    if (((uint)options >> 0x1e & 1) == 0) {
      puVar5 = (undefined8 *)xmlCreateFileParserCtxt(filename);
      if (((uint)options >> 9 & 1) == 0) {
        memcpy((void *)*puVar5,&debugSAX2HandlerStruct,0x100);
      }
      else {
        memcpy((void *)*puVar5,&debugSAXHandlerStruct,0x100);
        options = options + -0x200;
      }
      iVar11 = 0;
      local_48 = filename;
      local_40 = xmlHashCreate(0);
      local_38 = xmlHashCreate(0);
      puVar5[1] = &local_48;
      xmlCtxtUseOptions(puVar5,options);
      xmlParseDocument(puVar5);
      if (*(int *)(puVar5 + 3) == 0) {
        iVar11 = *(int *)(puVar5 + 0x11);
      }
      xmlHashFree(local_40,hashFreeEntity);
      xmlHashFree(local_38,hashFreeEntity);
      xmlFreeDoc(puVar5[2]);
      xmlFreeParserCtxt(puVar5);
    }
    else {
      iVar11 = 0;
      uVar6 = htmlNewSAXParserCtxt(&debugHTMLSAXHandlerStruct,0);
      htmlCtxtReadFile(uVar6,filename,0,options);
      htmlFreeParserCtxt(uVar6);
    }
    fclose((FILE *)SAXdebug);
    iVar3 = compareFiles(__filename,result);
    if (iVar3 != 0) {
      pcVar9 = "Got a difference for %s\n";
      goto LAB_00109682;
    }
  }
  else {
    pcVar9 = "Failed to parse %s\n";
LAB_00109682:
    fprintf(_stderr,pcVar9,filename);
    iVar11 = 1;
  }
  unlink(__filename);
LAB_00109635:
  free(__filename);
  return iVar11;
}

Assistant:

static int
saxParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
             int options) {
    int ret;
    char *temp;

    nb_tests++;
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }
    SAXdebug = fopen(temp, "wb");
    if (SAXdebug == NULL) {
        fprintf(stderr, "Failed to write to %s\n", temp);
	free(temp);
	return(-1);
    }

#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        htmlParserCtxtPtr ctxt;

        ctxt = htmlNewSAXParserCtxt(emptySAXHandler, NULL);
        htmlCtxtReadFile(ctxt, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
	ret = 0;
    } else
#endif
    {
        xmlParserCtxtPtr ctxt = xmlCreateFileParserCtxt(filename);
        memcpy(ctxt->sax, emptySAXHandler, sizeof(xmlSAXHandler));
        xmlCtxtUseOptions(ctxt, options);
        xmlParseDocument(ctxt);
        ret = ctxt->wellFormed ? 0 : ctxt->errNo;
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }
    if (ret == XML_ERR_UNDECLARED_ENTITY) {
        fprintf(SAXdebug, "xmlParseDocument returned error %d\n", ret);
        ret = 0;
    }
    if (ret != 0) {
        fprintf(stderr, "Failed to parse %s\n", filename);
	ret = 1;
	goto done;
    }
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        htmlParserCtxtPtr ctxt;

        ctxt = htmlNewSAXParserCtxt(debugHTMLSAXHandler, NULL);
        htmlCtxtReadFile(ctxt, filename, NULL, options);
        htmlFreeParserCtxt(ctxt);
	ret = 0;
    } else
#endif
    {
        debugContext userData;
        xmlParserCtxtPtr ctxt = xmlCreateFileParserCtxt(filename);

        if (options & XML_PARSE_SAX1) {
            memcpy(ctxt->sax, debugSAXHandler, sizeof(xmlSAXHandler));
            options -= XML_PARSE_SAX1;
        } else {
            memcpy(ctxt->sax, debugSAX2Handler, sizeof(xmlSAXHandler));
        }
        userData.filename = filename;
        userData.generalEntities = xmlHashCreate(0);
        userData.parameterEntities = xmlHashCreate(0);
        ctxt->userData = &userData;
        xmlCtxtUseOptions(ctxt, options);
        xmlParseDocument(ctxt);
        ret = ctxt->wellFormed ? 0 : ctxt->errNo;
        xmlHashFree(userData.generalEntities, hashFreeEntity);
        xmlHashFree(userData.parameterEntities, hashFreeEntity);
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }
    fclose(SAXdebug);
    if (compareFiles(temp, result)) {
        fprintf(stderr, "Got a difference for %s\n", filename);
        ret = 1;
    }

done:
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(ret);
}